

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool cmFortranParser_FilePop(cmFortranParser *parser)

{
  _Elt_pointer pcVar1;
  _Elt_pointer pcVar2;
  YY_BUFFER_STATE_conflict1 b;
  _Elt_pointer pcVar3;
  cmFortranFile f;
  undefined1 local_58 [48];
  
  pcVar1 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pcVar2 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 != pcVar1) {
    pcVar3 = pcVar2;
    if (pcVar2 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    cmFortranFile::cmFortranFile((cmFortranFile *)local_58,pcVar3 + -1);
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::pop_back(&(parser->FileStack).c);
    fclose((FILE *)local_58._0_8_);
    b = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    cmFortran_yy_delete_buffer(b,parser->Scanner);
    cmFortran_yy_switch_to_buffer((YY_BUFFER_STATE_conflict1)local_58._8_8_,parser->Scanner);
    std::__cxx11::string::~string((string *)(local_58 + 0x10));
  }
  return pcVar2 != pcVar1;
}

Assistant:

void cmFortranParser_RuleModule(cmFortranParser* parser,
                                       const char* name)
{
  if(!parser->InPPFalseBranch && !parser->InInterface)
    {
    parser->Info.Provides.insert(cmSystemTools::LowerCase(name));
    }
}